

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unixFullPathname(unqlite_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  sxu32 sVar1;
  char *pcVar2;
  int iVar3;
  
  if (*zPath == '/') {
    iVar3 = 0;
    Systrcpy(zOut,nOut,zPath,0);
  }
  else {
    zOut[(long)nOut + -1] = '\0';
    pcVar2 = getcwd(zOut,(long)nOut - 1);
    if (pcVar2 == (char *)0x0) {
      iVar3 = -2;
    }
    else {
      sVar1 = SyStrlen(zOut);
      iVar3 = 0;
      SyBufferFormat(zOut + sVar1,nOut - sVar1,"/%s",zPath);
    }
  }
  return iVar3;
}

Assistant:

static int unixFullPathname(
  unqlite_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  if( zPath[0]=='/' ){
	  Systrcpy(zOut,(sxu32)nOut,zPath,0);
	  SXUNUSED(pVfs);
  }else{
    sxu32 nCwd;
	zOut[nOut-1] = '\0';
    if( getcwd(zOut, nOut-1)==0 ){
		return UNQLITE_IOERR;
    }
    nCwd = SyStrlen(zOut);
    SyBufferFormat(&zOut[nCwd],(sxu32)nOut-nCwd,"/%s",zPath);
  }
  return UNQLITE_OK;
}